

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getNameAndFloat(int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  int iVar1;
  char *__s;
  Attribute *pAVar2;
  invalid_argument *this;
  double dVar3;
  allocator<char> local_75;
  float f;
  string local_70 [32];
  SetAttr local_50;
  
  iVar1 = *i;
  if (iVar1 <= argc + -3) {
    __s = argv[(long)iVar1 + 1];
    dVar3 = strtod(argv[(long)iVar1 + 2],(char **)0x0);
    f = (float)dVar3;
    std::__cxx11::string::string<std::allocator<char>>(local_70,__s,&local_75);
    pAVar2 = (Attribute *)operator_new(0x10);
    Imf_3_2::TypedAttribute<float>::TypedAttribute((float *)pAVar2);
    std::__cxx11::string::string((string *)&local_50,local_70);
    local_50.part = part;
    local_50.attr = pAVar2;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string(local_70);
    *i = *i + 3;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a name and a float");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getNameAndFloat (int argc, char** argv, int& i, int part, SetAttrVector& attrs)
{
    if (i > argc - 3)
        throw invalid_argument("Expected a name and a float");

    const char* attrName = argv[i + 1];
    float       f        = static_cast<float> (strtod (argv[i + 2], 0));
    attrs.push_back (SetAttr (attrName, part, new FloatAttribute (f)));
    i += 3;
}